

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

void nni_http_set_body(nng_http *conn,void *data,size_t size)

{
  nni_http_entity *entity;
  
  entity = &(conn->res).data;
  if (conn->client != false) {
    entity = &(conn->req).data;
  }
  http_set_data(entity,data,size);
  nni_http_set_content_length(conn,size);
  return;
}

Assistant:

void
nni_http_set_body(nng_http *conn, void *data, size_t size)
{
	if (conn->client) {
		http_set_data(&conn->req.data, data, size);
	} else {
		http_set_data(&conn->res.data, data, size);
	}
	nni_http_set_content_length(conn, size);
}